

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

int alignSeq(string *a,string *b)

{
  char cVar1;
  int iVar2;
  size_type __n;
  size_type __n_00;
  reference pvVar3;
  reference pvVar4;
  char *pcVar5;
  int *piVar6;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int sim;
  int j_1;
  int i_1;
  int j;
  int i;
  int maxScore;
  allocator<int> local_51;
  vector<int,_std::allocator<int>_> local_50;
  undefined1 local_38 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  m;
  int cols;
  int rows;
  string *b_local;
  string *a_local;
  
  iVar2 = std::__cxx11::string::size();
  m.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar2 + 1;
  iVar2 = std::__cxx11::string::size();
  m.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = iVar2 + 1;
  __n = (size_type)
        m.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  __n_00 = (size_type)
           (int)m.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<int>::allocator(&local_51);
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__n_00,&local_51);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&i + 3));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_38,__n,&local_50,
           (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&i + 3));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&i + 3));
  std::vector<int,_std::allocator<int>_>::~vector(&local_50);
  std::allocator<int>::~allocator(&local_51);
  j = 0;
  for (i_1 = 0; i_1 < m.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; i_1 = i_1 + 1) {
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_38,(long)i_1);
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(pvVar3,0);
    *pvVar4 = 0;
  }
  for (j_1 = 0; j_1 < (int)m.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage; j_1 = j_1 + 1) {
    iVar2 = -j_1;
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_38,0);
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(pvVar3,(long)j_1);
    *pvVar4 = iVar2;
  }
  for (sim = 1; iVar2 = j,
      sim < m.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; sim = sim + 1) {
    for (local_7c = 1;
        local_7c <
        (int)m.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage; local_7c = local_7c + 1) {
      pcVar5 = (char *)std::__cxx11::string::at((ulong)a);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::at((ulong)b);
      iVar2 = ((cVar1 == *pcVar5) - 1) + (uint)(cVar1 == *pcVar5);
      local_80 = iVar2;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)local_38,(long)(sim + -1));
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(pvVar3,(long)(local_7c + -1));
      local_84 = iVar2 + *pvVar4;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)local_38,(long)(sim + -1));
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(pvVar3,(long)local_7c);
      local_88 = *pvVar4 + -1;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)local_38,(long)sim);
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(pvVar3,(long)(local_7c + -1));
      local_8c = *pvVar4 + -1;
      piVar6 = std::max<int>(&local_88,&local_8c);
      piVar6 = std::max<int>(&local_84,piVar6);
      iVar2 = *piVar6;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)local_38,(long)sim);
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(pvVar3,(long)local_7c);
      *pvVar4 = iVar2;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)local_38,(long)sim);
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(pvVar3,(long)local_7c);
      piVar6 = std::max<int>(&j,pvVar4);
      j = *piVar6;
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_38);
  return iVar2;
}

Assistant:

int alignSeq(const std::string &a, const std::string &b)
{
	int rows = a.size() + 1;
	int cols = b.size() + 1;

	std::vector<std::vector<int>> m(rows, std::vector<int>(cols));
	int maxScore = 0;
	for (int i = 0; i < rows; ++i)
		m.at(i).at(0) = 0;
	for (int j = 0; j < cols; ++j)
		m.at(0).at(j) = j * GAP_PENALTY;
	for (int i = 1; i < rows; ++i)
	{
		for (int j = 1; j < cols; ++j)
		{
			int sim = a.at(i - 1) == b.at(j - 1) ? MATCH_SCORE : MIS_MATCH_SCORE;
			m.at(i).at(j) = std::max(sim + m.at(i - 1).at(j - 1),
									 std::max(GAP_PENALTY + m.at(i - 1).at(j), GAP_PENALTY + m.at(i).at(j - 1)));
			maxScore = std::max(maxScore, m.at(i).at(j));
		}
	}
	return maxScore;
}